

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

void conversion(void)

{
  uint uVar1;
  long in_RAX;
  int *__ptr;
  long lVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int *piVar7;
  int N;
  undefined8 uStack_38;
  uint uVar6;
  
  uStack_38 = in_RAX;
  __ptr = (int *)malloc(400);
  if (__ptr == (int *)0x0) {
    printf(anon_var_dwarf_2b);
  }
  __isoc99_scanf("%d",(long)&uStack_38 + 4);
  if (uStack_38._4_4_ != 0) {
    iVar3 = 100;
    piVar7 = __ptr;
    iVar5 = uStack_38._4_4_;
    do {
      lVar4 = (long)iVar3;
      if (lVar4 <= (long)piVar7 - (long)__ptr >> 2) {
        lVar2 = (long)iVar3;
        iVar3 = iVar3 + 10;
        __ptr = (int *)realloc(__ptr,lVar2 * 4 + 0x28);
        piVar7 = __ptr + lVar4;
      }
      *piVar7 = iVar5 % 8;
      piVar7 = piVar7 + 1;
      uVar1 = uStack_38._4_4_ + 7;
      uVar6 = uStack_38._4_4_;
      if (uStack_38 < 0) {
        uVar6 = uVar1;
      }
      iVar5 = (int)uVar6 >> 3;
      uStack_38 = CONCAT44(iVar5,(undefined4)uStack_38);
    } while (0xe < uVar1);
    for (; piVar7 != __ptr; piVar7 = piVar7 + -1) {
      printf("%d",(ulong)(uint)piVar7[-1]);
    }
  }
  return;
}

Assistant:

void conversion(){
    int N;  //十进制整数
    SqStack S;
    S = InitStack(S);   //构造空栈
    scanf("%d",&N);
    while(N){
        S = Push(S,N % 8);
        N = N / 8;
    }
    while(S.top != S.base){
        printf("%d",*--S.top);
    }
}